

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  undefined8 in_RSI;
  int in_EDI;
  bool unaff_retaddr;
  int in_stack_00000054;
  string *in_stack_00000058;
  LogSeverity in_stack_00000064;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_EDI == 0) {
    Log(in_stack_00000064,in_stack_00000058,in_stack_00000054);
  }
  else if (in_EDI == 1) {
    Log(in_stack_00000064,in_stack_00000058,in_stack_00000054);
  }
  else {
    Expect(unaff_retaddr,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
           (int)((ulong)in_RSI >> 0x20),(string *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const string& msg) {
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, 3);
      break;
    case kWarn:
      Log(kWarning, msg, 3);
      break;
    default:  // FAIL
      Expect(false, NULL, -1, msg);
  }
}